

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

void * rw::gl3::copyNativeRaster(void *dst,void *param_2,int32 offset,int32 param_4)

{
  Gl3Raster *d;
  int32 param_3_local;
  int32 offset_local;
  void *param_1_local;
  void *dst_local;
  
  *(undefined4 *)((long)dst + (long)offset + 0x10) = 0;
  *(undefined4 *)((long)dst + (long)offset + 0x20) = 0;
  *(undefined8 *)((long)dst + (long)offset + 0x28) = 0;
  *(undefined8 *)((long)dst + (long)offset + 0x30) = 0;
  return dst;
}

Assistant:

static void*
copyNativeRaster(void *dst, void *, int32 offset, int32)
{
	Gl3Raster *d = PLUGINOFFSET(Gl3Raster, dst, offset);
	d->texid = 0;
	d->fbo = 0;
	d->fboMate = nil;
	d->backingStore = nil;
	return dst;
}